

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O3

int AF_A_FireArrow(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  VM_UBYTE VVar2;
  undefined8 *puVar3;
  AWeapon *this;
  APlayerPawn *this_00;
  PClass *pPVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_var;
  PClass *pPVar8;
  PClassActor *pPVar9;
  AActor *source;
  VMValue *pVVar10;
  char *pcVar11;
  PClassActor *type;
  byte bVar12;
  bool bVar13;
  bool bVar14;
  FSoundID local_2c;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar11 = "(paramnum) < numparam";
    goto LAB_005f8d61;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005f8d29;
  source = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (source == (AActor *)0x0) goto LAB_005f8abe;
    pPVar8 = (source->super_DThinker).super_DObject.Class;
    if (pPVar8 == (PClass *)0x0) {
      iVar5 = (**(source->super_DThinker).super_DObject._vptr_DObject)(source);
      pPVar8 = (PClass *)CONCAT44(extraout_var,iVar5);
      (source->super_DThinker).super_DObject.Class = pPVar8;
    }
    bVar13 = pPVar8 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar13;
    bVar14 = pPVar8 == pPVar4;
    if (!bVar14 && !bVar13) {
      do {
        pPVar8 = pPVar8->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
        if (pPVar8 == pPVar4) break;
      } while (pPVar8 != (PClass *)0x0);
    }
    pVVar10 = (VMValue *)(ulong)(bVar14 || bVar13);
    uVar6 = (uint)bVar13;
    if ((char)ret == '\0') {
      pcVar11 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005f8d61;
    }
  }
  else {
    if (source != (AActor *)0x0) goto LAB_005f8d29;
LAB_005f8abe:
    source = (AActor *)0x0;
    pVVar10 = param;
    uVar6 = numparam;
  }
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar2 = param[1].field_0.field_3.Type;
    if (VVar2 != 0xff) {
      if (VVar2 != '\x03') {
LAB_005f8d29:
        pcVar11 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005f8d61;
      }
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar3 != (undefined8 *)0x0) {
          pPVar8 = (PClass *)puVar3[1];
          if (pPVar8 == (PClass *)0x0) {
            pPVar8 = (PClass *)(**(code **)*puVar3)(puVar3,pVVar10,uVar6,ret);
            puVar3[1] = pPVar8;
          }
          bVar13 = pPVar8 != (PClass *)0x0;
          if (pPVar8 != pPVar4 && bVar13) {
            do {
              pPVar8 = pPVar8->ParentClass;
              bVar13 = pPVar8 != (PClass *)0x0;
              if (pPVar8 == pPVar4) break;
            } while (pPVar8 != (PClass *)0x0);
          }
          if (!bVar13) {
            pcVar11 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_005f8d61;
          }
        }
      }
      else if (puVar3 != (undefined8 *)0x0) goto LAB_005f8d29;
    }
    if (2 < numparam) {
      VVar2 = param[2].field_0.field_3.Type;
      if ((VVar2 != 0xff) &&
         ((VVar2 != '\x03' ||
          ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
        pcVar11 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
        ;
LAB_005f8d61:
        __assert_fail(pcVar11,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                      ,0xfb,"int AF_A_FireArrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      if (numparam != 3) {
        if (param[3].field_0.field_3.Type == '\x03') {
          type = (PClassActor *)param[3].field_0.field_1.a;
          if (param[3].field_0.field_1.atag == 1) {
            if (type != (PClassActor *)0x0) {
              bVar12 = 1;
              pPVar9 = type;
              if (type == (PClassActor *)AActor::RegistrationInfo.MyClass) goto LAB_005f8bec;
              do {
                pPVar9 = (PClassActor *)(pPVar9->super_PClass).ParentClass;
                if (pPVar9 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
              } while (pPVar9 != (PClassActor *)0x0);
              if (pPVar9 != (PClassActor *)0x0) goto LAB_005f8bec;
              pcVar11 = "ti == NULL || ti->IsDescendantOf(RUNTIME_CLASS(AActor))";
              goto LAB_005f8d39;
            }
          }
          else if (type != (PClassActor *)0x0) goto LAB_005f8d32;
          bVar12 = 0;
          type = (PClassActor *)0x0;
LAB_005f8bec:
          if (source->player != (player_t *)0x0) {
            this = source->player->ReadyWeapon;
            if (this != (AWeapon *)0x0) {
              bVar13 = AWeapon::DepleteAmmo(this,this->bAltFire,true,-1);
              bVar12 = bVar12 & bVar13;
            }
            if (bVar12 != 0) {
              dVar1 = (source->Angles).Yaw.Degrees;
              uVar6 = FRandom::GenRand32(&pr_electric);
              uVar7 = FRandom::GenRand32(&pr_electric);
              this_00 = source->player->mo;
              iVar5 = (this_00->super_AActor).accuracy;
              (source->Angles).Yaw.Degrees =
                   (1.0 / (double)(1 << ((char)(uint)((ulong)((long)iVar5 * 0x66666667) >> 0x23) -
                                         (char)(iVar5 >> 0x1f) & 0x1fU))) *
                   (double)(int)((uVar6 & 0xff) - (uVar7 & 0xff)) * 0.02197265625 +
                   (source->Angles).Yaw.Degrees;
              APlayerPawn::PlayAttacking2(this_00);
              P_SpawnPlayerMissile(source,type);
              (source->Angles).Yaw.Degrees = dVar1;
              local_2c.ID = S_FindSound("weapons/xbowshoot");
              S_Sound(source,1,&local_2c,1.0,1.0);
            }
          }
          return 0;
        }
LAB_005f8d32:
        pcVar11 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005f8d39;
      }
    }
  }
  pcVar11 = "(paramnum) < numparam";
LAB_005f8d39:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0xfc,"int AF_A_FireArrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_FireArrow)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_CLASS(ti, AActor);

	DAngle savedangle;

	if (self->player == NULL)
		return 0;

	AWeapon *weapon = self->player->ReadyWeapon;
	if (weapon != NULL)
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire))
			return 0;
	}

	if (ti) 
	{
		savedangle = self->Angles.Yaw;
		self->Angles.Yaw += pr_electric.Random2() * (5.625/256) * self->player->mo->AccuracyFactor();
		self->player->mo->PlayAttacking2 ();
		P_SpawnPlayerMissile (self, ti);
		self->Angles.Yaw = savedangle;
		S_Sound (self, CHAN_WEAPON, "weapons/xbowshoot", 1, ATTN_NORM);
	}
	return 0;
}